

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O1

bool __thiscall
sptk::StatisticsAccumulation::Merge
          (StatisticsAccumulation *this,int num_data,vector<double,_std::allocator<double>_> *first,
          SymmetricMatrix *second,Buffer *buffer)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  double *pdVar8;
  double *pdVar9;
  uint uVar10;
  bool bVar11;
  ulong uVar12;
  size_type __new_size;
  long lVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  int column;
  double dVar17;
  Row local_80;
  double local_68;
  double local_60;
  SymmetricMatrix *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  Row local_48;
  
  bVar11 = false;
  if (((buffer != (Buffer *)0x0) && (bVar11 = false, 0 < num_data)) && (this->is_valid_ != false)) {
    __new_size = (long)this->num_order_ + 1;
    if (((this->num_statistics_order_ < 1) ||
        ((long)(first->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(first->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3 == __new_size)) &&
       ((this->num_statistics_order_ < 2 || (second->num_dimension_ == (int)__new_size)))) {
      if (buffer->zeroth_order_statistics_ == 0) {
        buffer->zeroth_order_statistics_ = num_data;
        if ((first->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start !=
            (first->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<double,_std::allocator<double>_>::operator=
                    (&buffer->first_order_statistics_,first);
        }
        bVar11 = true;
        if (second->num_dimension_ != 0) {
          SymmetricMatrix::operator=(&buffer->second_order_statistics_,second);
        }
      }
      else {
        if (this->numerically_stable_ == true) {
          if ((long)(buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3 != __new_size) {
            std::vector<double,_std::allocator<double>_>::resize(&buffer->delta_,__new_size);
          }
          pdVar8 = (buffer->first_order_statistics_).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar5 = (buffer->first_order_statistics_).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (pdVar8 != pdVar5) {
            pdVar6 = (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar7 = (first->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar13 = 0;
            do {
              pdVar9 = (double *)((long)pdVar8 + lVar13);
              *(double *)((long)pdVar6 + lVar13) = *pdVar9 - *(double *)((long)pdVar7 + lVar13);
              lVar13 = lVar13 + 8;
            } while (pdVar9 + 1 != pdVar5);
          }
        }
        pdVar6 = (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_60 = (double)buffer->zeroth_order_statistics_;
        local_68 = (double)num_data + local_60;
        buffer->zeroth_order_statistics_ = buffer->zeroth_order_statistics_ + num_data;
        local_50 = first;
        if (second->num_dimension_ != 0) {
          local_58 = second;
          if (this->numerically_stable_ == false) {
            if (-1 < this->num_order_) {
              iVar15 = 0;
              do {
                column = 0;
                if (this->diagonal_ != false) {
                  column = iVar15;
                }
                do {
                  local_80._vptr_Row = (_func_int **)&PTR__Row_00111d28;
                  local_80.matrix_ = second;
                  local_80.row_ = iVar15;
                  pdVar8 = SymmetricMatrix::Row::operator[](&local_80,column);
                  dVar17 = *pdVar8;
                  local_48._vptr_Row = (_func_int **)&PTR__Row_00111d28;
                  local_48.matrix_ = &buffer->second_order_statistics_;
                  local_48.row_ = iVar15;
                  pdVar8 = SymmetricMatrix::Row::operator[](&local_48,column);
                  *pdVar8 = dVar17 + *pdVar8;
                  column = column + 1;
                } while (iVar15 + 1 != column);
                bVar11 = iVar15 < this->num_order_;
                iVar15 = iVar15 + 1;
              } while (bVar11);
            }
          }
          else if (-1 < this->num_order_) {
            dVar17 = ((double)num_data * local_60) / local_68;
            uVar16 = 0;
            do {
              uVar14 = (uint)uVar16;
              uVar12 = 0;
              if (this->diagonal_ != false) {
                uVar12 = uVar16 & 0xffffffff;
              }
              uVar10 = (uint)uVar12;
              if ((uint)uVar12 <= uVar14) {
                uVar10 = uVar14;
              }
              do {
                local_80._vptr_Row = (_func_int **)&PTR__Row_00111d28;
                local_80.matrix_ = local_58;
                local_80.row_ = uVar14;
                pdVar8 = SymmetricMatrix::Row::operator[](&local_80,(int)uVar12);
                dVar2 = *pdVar8;
                dVar3 = pdVar6[uVar16];
                dVar4 = pdVar6[uVar12];
                local_80._vptr_Row = (_func_int **)&PTR__Row_00111d28;
                local_80.matrix_ = &buffer->second_order_statistics_;
                local_80.row_ = uVar14;
                pdVar8 = SymmetricMatrix::Row::operator[](&local_80,(int)uVar12);
                *pdVar8 = dVar3 * dVar17 * dVar4 + dVar2 + *pdVar8;
                uVar12 = uVar12 + 1;
              } while (uVar10 + 1 != uVar12);
              bVar11 = (long)uVar16 < (long)this->num_order_;
              uVar16 = uVar16 + 1;
            } while (bVar11);
          }
        }
        pdVar8 = (local_50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (local_50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        bVar11 = true;
        if (pdVar8 != pdVar5) {
          if (this->numerically_stable_ == true) {
            pdVar5 = (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar9 = (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (pdVar5 != pdVar9) {
              pdVar6 = (buffer->first_order_statistics_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar13 = 0;
              do {
                pdVar1 = (double *)((long)pdVar5 + lVar13);
                *(double *)((long)pdVar6 + lVar13) =
                     *pdVar1 * (local_60 / local_68) + *(double *)((long)pdVar8 + lVar13);
                lVar13 = lVar13 + 8;
              } while (pdVar1 + 1 != pdVar9);
            }
          }
          else {
            pdVar9 = (buffer->first_order_statistics_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            do {
              *pdVar9 = *pdVar8 + *pdVar9;
              pdVar8 = pdVar8 + 1;
              pdVar9 = pdVar9 + 1;
            } while (pdVar8 != pdVar5);
          }
        }
      }
    }
    else {
      bVar11 = false;
    }
  }
  return bVar11;
}

Assistant:

bool StatisticsAccumulation::Merge(
    int num_data, const std::vector<double>& first,
    const SymmetricMatrix& second,
    StatisticsAccumulation::Buffer* buffer) const {
  if (!is_valid_ || num_data <= 0 || NULL == buffer) {
    return false;
  }

  const std::size_t length(num_order_ + 1);
  if (1 <= num_statistics_order_ && first.size() != length) {
    return false;
  }
  if (2 <= num_statistics_order_ &&
      second.GetNumDimension() != static_cast<int>(length)) {
    return false;
  }

  // Copy statistics if the buffer is empty.
  if (0 == buffer->zeroth_order_statistics_) {
    buffer->zeroth_order_statistics_ = num_data;
    if (!first.empty()) buffer->first_order_statistics_ = first;
    if (!second.Empty()) buffer->second_order_statistics_ = second;
    return true;
  }

  // Compute delta.
  if (numerically_stable_) {
    if (buffer->delta_.size() != length) {
      buffer->delta_.resize(length);
    }
    std::transform(buffer->first_order_statistics_.begin(),
                   buffer->first_order_statistics_.end(), first.begin(),
                   buffer->delta_.begin(), std::minus<double>());
  }
  const double* delta(&(buffer->delta_[0]));

  const double m(static_cast<double>(buffer->zeroth_order_statistics_));
  const double n(static_cast<double>(num_data));
  const double mpn(m + n);
  const double mn(m * n);
  buffer->zeroth_order_statistics_ += num_data;

  // Merge 2nd order statistics.
  if (!second.Empty()) {
    if (numerically_stable_) {
      const double c(mn / mpn);
      for (int i(0); i <= num_order_; ++i) {
        for (int j(diagonal_ ? i : 0); j <= i; ++j) {
          const double term1(second[i][j]);
          const double term2(c * delta[i] * delta[j]);
          buffer->second_order_statistics_[i][j] += term1 + term2;
        }
      }
    } else {
      for (int i(0); i <= num_order_; ++i) {
        for (int j(diagonal_ ? i : 0); j <= i; ++j) {
          buffer->second_order_statistics_[i][j] += second[i][j];
        }
      }
    }
  }

  // Merge 1st order statistics.
  if (!first.empty()) {
    if (numerically_stable_) {
      const double c(m / mpn);
      std::transform(buffer->delta_.begin(), buffer->delta_.end(),
                     first.begin(), buffer->first_order_statistics_.begin(),
                     [c](double x, double y) { return c * x + y; });
    } else {
      std::transform(
          first.begin(), first.end(), buffer->first_order_statistics_.begin(),
          buffer->first_order_statistics_.begin(), std::plus<double>());
    }
  }

  return true;
}